

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.c
# Opt level: O1

int rtr_undo_update_spki_table_batch
              (rtr_socket *rtr_socket,spki_table *spki_table,pdu_router_key *pdus,size_t pdu_count)

{
  int iVar1;
  uint8_t *puVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  bool bVar4;
  bool bVar5;
  spki_record local_b8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = pdu_count != 0;
  if (bVar4) {
    puVar2 = &pdus->type;
    uVar3 = 1;
    do {
      if (*puVar2 != '\t') {
        __assert_fail("type == ROUTER_KEY",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/rtr/packets.c"
                      ,0x318,
                      "int rtr_undo_update_spki_table(struct rtr_socket *, struct spki_table *, void *)"
                     );
      }
      local_b8.asn = *(uint32_t *)(puVar2 + 0x1b);
      local_b8.ski._0_8_ = *(undefined8 *)(puVar2 + 7);
      local_b8.ski._8_8_ = *(undefined8 *)(puVar2 + 0xf);
      local_b8.ski._16_4_ = *(undefined4 *)(puVar2 + 0x17);
      memcpy(local_b8.spki,puVar2 + 0x1f,0x5b);
      local_b8.socket = rtr_socket;
      if (puVar2[1] == '\0') {
        iVar1 = spki_table_add_entry(spki_table,&local_b8);
      }
      else {
        iVar1 = -1;
        if (puVar2[1] == '\x01') {
          iVar1 = spki_table_remove_entry(spki_table,&local_b8);
        }
      }
      if (iVar1 == -1) {
        lrtr_dbg(
                "RTR Socket: Couldn\'t undo all update operations from failed data synchronisation: Purging all SPKI records"
                );
        spki_table_src_remove(spki_table,rtr_socket);
        break;
      }
      bVar4 = uVar3 < pdu_count;
      puVar2 = puVar2 + 0x7b;
      bVar5 = uVar3 != pdu_count;
      uVar3 = uVar3 + 1;
    } while (bVar5);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return -(uint)bVar4;
}

Assistant:

static int rtr_undo_update_spki_table_batch(struct rtr_socket *rtr_socket, struct spki_table *spki_table,
					    struct pdu_router_key *pdus, size_t pdu_count)
{
	for (size_t i = 0; i < pdu_count; i++) {
		int res = rtr_undo_update_spki_table(rtr_socket, spki_table, &(pdus[i]));

		if (res == RTR_ERROR || res == SPKI_ERROR) {
			// Undo failed, cannot recover, remove all records associated with the socket instead
			RTR_DBG1(
				"Couldn't undo all update operations from failed data synchronisation: Purging all SPKI records");
			spki_table_src_remove(spki_table, rtr_socket);
			return RTR_ERROR;
		}
	}
	return RTR_SUCCESS;
}